

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O3

void __thiscall Assimp::STEP::SyntaxError::SyntaxError(SyntaxError *this,string *s,uint64_t line)

{
  string local_68;
  string local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  AddLineNumber(&local_48,s,line,&local_68);
  std::runtime_error::runtime_error((runtime_error *)this,(string *)&local_48);
  *(undefined ***)&this->super_DeadlyImportError = &PTR__runtime_error_0080bf48;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&this->super_DeadlyImportError = &PTR__runtime_error_008da470;
  return;
}

Assistant:

STEP::SyntaxError::SyntaxError (const std::string& s,uint64_t line /* = LINE_NOT_SPECIFIED */)
: DeadlyImportError(AddLineNumber(s,line))
{

}